

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void spr_write_decr(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGTemp *local_28;
  TCGv_i64 local_20;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
    gen_io_start(tcg_ctx);
  }
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[gprn]);
  tcg_gen_callN_ppc64(tcg_ctx,helper_store_decr_ppc64,(TCGTemp *)0x0,2,&local_28);
  if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
    gen_stop_exception(ctx);
  }
  return;
}

Assistant:

static void spr_write_decr(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    gen_helper_store_decr(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[gprn]);
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_stop_exception(ctx);
    }
}